

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

void sym_Export(char *symName)

{
  Symbol *pSVar1;
  
  if (*symName == '!') {
    error("Anonymous labels cannot be exported\n");
    return;
  }
  pSVar1 = sym_FindScopedSymbol(symName);
  if (pSVar1 == (Symbol *)0x0) {
    pSVar1 = sym_Ref(symName);
  }
  pSVar1->isExported = true;
  return;
}

Assistant:

void sym_Export(char const *symName)
{
	if (symName[0] == '!') {
		error("Anonymous labels cannot be exported\n");
		return;
	}

	struct Symbol *sym = sym_FindScopedSymbol(symName);

	// If the symbol doesn't exist, create a ref that can be purged
	if (!sym)
		sym = sym_Ref(symName);
	sym->isExported = true;
}